

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O1

Value * __thiscall flow::IRBuilder::createSIn(IRBuilder *this,Value *lhs,Value *rhs,string *name)

{
  BasicBlock *pBVar1;
  BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *pBVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  string local_80;
  Value *local_60;
  Value *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_60 = rhs;
  local_58 = lhs;
  if (lhs == (Value *)0x0) {
    pBVar2 = (BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *)0x0;
  }
  else {
    pBVar2 = (BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *)
             __dynamic_cast(lhs,&Value::typeinfo,
                            &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
  }
  if (pBVar2 == (BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *)0x0) {
    bVar5 = true;
  }
  else {
    if (rhs == (Value *)0x0) {
      lVar3 = 0;
    }
    else {
      lVar3 = __dynamic_cast(rhs,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
    }
    bVar5 = lVar3 == 0;
    if (!bVar5) {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,*(long *)(lVar3 + 0x48),
                 *(long *)(lVar3 + 0x50) + *(long *)(lVar3 + 0x48));
      pBVar1 = (pBVar2->super_Instr).basicBlock_;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pBVar1,
                 (long)&(pBVar1->super_Value)._vptr_Value +
                 (long)(pBVar2->super_Instr).operands_.
                       super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                       super__Vector_impl_data._M_start);
      lVar3 = std::__cxx11::string::find((char *)&local_80,(ulong)local_50[0],0);
      lVar4 = 0x18;
      if (lVar3 == -1) {
        lVar4 = 0x68;
      }
      pBVar2 = (BinaryInstr<(flow::BinaryOperator)31,_(flow::LiteralType)1> *)
               ((long)&(this->program_->modules_).
                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar4);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (bVar5) {
    makeName(&local_80,this,name);
    pBVar2 = insert<flow::BinaryInstr<(flow::BinaryOperator)31,(flow::LiteralType)1>,flow::Value*&,flow::Value*&,std::__cxx11::string>
                       (this,&local_58,&local_60,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
  }
  return (Value *)pBVar2;
}

Assistant:

Value* IRBuilder::createSIn(Value* lhs, Value* rhs, const std::string& name) {
  if (auto a = dynamic_cast<ConstantString*>(lhs))
    if (auto b = dynamic_cast<ConstantString*>(rhs))
      return getBoolean(b->get().find(a->get()) != std::string::npos);

  return insert<SInInstr>(lhs, rhs, makeName(name));
}